

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# docopt_private.h
# Opt level: O2

void __thiscall
docopt::BranchPattern::collect_leaves
          (BranchPattern *this,
          vector<docopt::LeafPattern_*,_std::allocator<docopt::LeafPattern_*>_> *lst)

{
  pointer psVar1;
  element_type *peVar2;
  shared_ptr<docopt::Pattern> *child;
  pointer psVar3;
  
  psVar1 = (this->fChildren).
           super__Vector_base<std::shared_ptr<docopt::Pattern>,_std::allocator<std::shared_ptr<docopt::Pattern>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  for (psVar3 = (this->fChildren).
                super__Vector_base<std::shared_ptr<docopt::Pattern>,_std::allocator<std::shared_ptr<docopt::Pattern>_>_>
                ._M_impl.super__Vector_impl_data._M_start; psVar3 != psVar1; psVar3 = psVar3 + 1) {
    peVar2 = (psVar3->super___shared_ptr<docopt::Pattern,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
    (*peVar2->_vptr_Pattern[1])(peVar2,lst);
  }
  return;
}

Assistant:

virtual void collect_leaves(std::vector<LeafPattern*>& lst) override final {
			for(auto& child : fChildren) {
				child->collect_leaves(lst);
			}
		}